

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parametric.cxx
# Opt level: O0

string * __thiscall
Parametric::getConfiguration_abi_cxx11_(string *__return_storage_ptr__,Parametric *this)

{
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  Parametric *local_18;
  Parametric *this_local;
  string *config;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Parametric *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::operator+(&local_c0,"\"",&this->parametricName);
  std::operator+(&local_a0,&local_c0,"\" ");
  std::operator+(&local_80,&local_a0,&this->parametricType);
  std::operator+(&local_60,&local_80,'\n');
  getAllParameters_abi_cxx11_(&local_f0,this);
  std::operator+(&local_40,&local_60,&local_f0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

string Parametric::getConfiguration() const
{
	string config;
	config += "\"" + parametricName + "\" " + parametricType + '\n' + getAllParameters();
	return config;
}